

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O3

int __thiscall
VVCStreamReader::getTSDescriptor
          (VVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  uint8_t *buffer;
  VvcSpsUnit *pVVar1;
  pointer puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  pointer puVar7;
  byte *pbVar8;
  uint height;
  uint width;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  CheckStreamRez rez;
  uint8_t local_ca;
  byte local_c9;
  CheckStreamRez local_c8;
  
  if (this->m_firstFrame == true) {
    buffer = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer;
    checkStream(&local_c8,this,buffer,
                *(int *)&(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)buffer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.lang._M_dataplus._M_p != &local_c8.lang.field_2) {
      operator_delete(local_c8.lang._M_dataplus._M_p,local_c8.lang.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.streamDescr._M_dataplus._M_p != &local_c8.streamDescr.field_2) {
      operator_delete(local_c8.streamDescr._M_dataplus._M_p,
                      local_c8.streamDescr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.codecInfo.programName._M_dataplus._M_p !=
        &local_c8.codecInfo.programName.field_2) {
      operator_delete(local_c8.codecInfo.programName._M_dataplus._M_p,
                      local_c8.codecInfo.programName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.codecInfo.displayName._M_dataplus._M_p !=
        &local_c8.codecInfo.displayName.field_2) {
      operator_delete(local_c8.codecInfo.displayName._M_dataplus._M_p,
                      local_c8.codecInfo.displayName.field_2._M_allocated_capacity + 1);
    }
  }
  if (hdmvDescriptors) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = '3';
    pVVar1 = this->m_sps;
    if (pVVar1 == (VvcSpsUnit *)0x0) {
      width = 0;
      height = 0;
    }
    else {
      width = pVVar1->pic_width_max_in_luma_samples;
      height = pVVar1->pic_height_max_in_luma_samples;
    }
    M2TSStreamInfo::blurayStreamParams
              ((this->super_MPEGStreamReader).m_fps,false,width,height,
               (this->super_MPEGStreamReader).m_streamAR,(uint8_t *)&local_c8,&local_c9,&local_ca);
    dstBuff[8] = (char)local_c8.codecInfo.codecID << 4 | local_c9;
    dstBuff[9] = local_ca << 4 | 0xf;
    iVar6 = 10;
  }
  else {
    *dstBuff = '9';
    dstBuff[2] = (this->m_sps->super_VvcUnitWithProfile).profile_idc * '\x02' |
                 (this->m_sps->super_VvcUnitWithProfile).tier_flag;
    dstBuff[3] = (this->m_sps->super_VvcUnitWithProfile).ptl_num_sub_profiles;
    pVVar1 = this->m_sps;
    puVar2 = (pVVar1->super_VvcUnitWithProfile).general_sub_profile_idc.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = (uint *)(dstBuff + 4);
    puVar4 = (uint *)dstBuff;
    for (puVar7 = (pVVar1->super_VvcUnitWithProfile).general_sub_profile_idc.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 = puVar5, puVar7 != puVar2;
        puVar7 = puVar7 + 1) {
      *puVar3 = *puVar7;
      puVar5 = puVar3 + 1;
      puVar4 = puVar3;
    }
    *(char *)puVar3 =
         (pVVar1->super_VvcUnitWithProfile).ptl_frame_only_constraint_flag << 4 |
         pVVar1->non_packed_constraint_flag << 5 |
         pVVar1->interlaced_source_flag << 6 | pVVar1->progressive_source_flag << 7;
    *(uint8_t *)((long)puVar4 + 5) = (this->m_sps->super_VvcUnitWithProfile).level_idc;
    ((byte *)((long)puVar4 + 6))[0] = 0;
    ((byte *)((long)puVar4 + 6))[1] = 0xc0;
    pbVar8 = (byte *)((long)puVar4 + (8 - (long)dstBuff));
    iVar6 = (int)pbVar8;
    dstBuff[1] = (char)pbVar8 + 0xfe;
  }
  return iVar6;
}

Assistant:

int VVCStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    if (hdmvDescriptors)
    {
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;

        *dstBuff++ = static_cast<int>(StreamType::VIDEO_H266);  // stream_coding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);

        return 10;  // total descriptor length
    }

    const uint8_t* descStart = dstBuff;

    // ITU-T Rec.H.222 Table 2-133 - VVC video descriptor
    *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::VVC);
    uint8_t* descLength = dstBuff++;  // descriptor length, filled at the end
    *dstBuff++ = static_cast<uint8_t>(m_sps->profile_idc << 1 | m_sps->tier_flag);
    *dstBuff++ = m_sps->ptl_num_sub_profiles;
    auto bufPos = reinterpret_cast<uint32_t*>(dstBuff);
    for (const auto i : m_sps->general_sub_profile_idc) *bufPos++ = i;
    dstBuff = reinterpret_cast<uint8_t*>(bufPos);
    *dstBuff++ =
        static_cast<uint8_t>(m_sps->progressive_source_flag << 7 | m_sps->interlaced_source_flag << 6 |
                             m_sps->non_packed_constraint_flag << 5 | m_sps->ptl_frame_only_constraint_flag << 4);
    *dstBuff++ = m_sps->level_idc;
    *dstBuff++ = 0;
    *dstBuff++ = 0xc0;

    const uint8_t* descEnd = dstBuff;
    const auto descSize = static_cast<int>(descEnd - descStart);
    *descLength = static_cast<uint8_t>(descSize - 2);  // fill descriptor length

    return descSize;
}